

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Latency_Coding_Lowpass_Example_Results.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  char *pcVar1;
  time_t tVar2;
  Clock *this;
  ANN *this_00;
  Parameters *param;
  Population *this_01;
  ArtificialPopulation *this_02;
  Population *this_03;
  Population *this_04;
  Population *this_05;
  LatencyEncodingSynapse_param *pLVar3;
  LatencyEncodingSynapse *this_06;
  LatencyDecodingSynapse_param *pLVar4;
  LatencyDecodingSynapse *this_07;
  LatencyEncodingSynapse *this_08;
  LatencyDecodingSynapse *this_09;
  Network_param *param_00;
  ostream *poVar5;
  string filterType;
  Network n;
  double local_180;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  double local_140;
  long *local_138;
  char *local_130;
  long local_128 [2];
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  Network local_78;
  
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  local_138 = local_128;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"lowpass","");
  if (argc == 0xb) {
    local_170 = atof(argv[1]);
    local_178 = atof(argv[2]);
    local_140 = atof(argv[3]);
    local_148 = atof(argv[4]);
    local_150 = atof(argv[5]);
    local_160 = atof(argv[6]);
    local_158 = atof(argv[7]);
    local_180 = atof(argv[8]);
    local_168 = atof(argv[9]);
    pcVar1 = local_130;
    __s = argv[10];
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_138,0,pcVar1,(ulong)__s);
  }
  else {
    local_170 = 1.0;
    local_158 = 0.0;
    local_180 = 20.0;
    local_168 = 0.0001;
    local_160 = 0.0;
    local_150 = 0.0;
    local_148 = 0.0;
    local_140 = 0.0;
    local_178 = 0.0;
  }
  this = Clock::getInstance();
  Clock::setDt(this,local_168);
  this_00 = (ANN *)operator_new(0x40);
  ANN::ANN(this_00);
  ANN::setInputSize(this_00,1);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,local_138,local_130 + (long)local_138);
  ANN::addLayer(this_00,1,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  param = (Parameters *)operator_new(0x58);
  *(undefined8 *)(param + 0x48) = 0;
  *(undefined8 *)(param + 0x50) = 0;
  *(double *)param = local_170;
  *(double *)(param + 8) = local_178;
  *(double *)(param + 0x10) = local_140;
  *(double *)(param + 0x18) = local_148;
  *(double *)(param + 0x20) = local_150;
  *(double *)(param + 0x28) = local_160;
  *(double *)(param + 0x30) = local_158;
  *(undefined8 *)(param + 0x38) = 0x3fc999999999999a;
  *(undefined8 *)(param + 0x40) = 0x3fe0000000000000;
  this_01 = (Population *)operator_new(0x60);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"SignalGenerator","");
  Population::Population(this_01,1,&local_b8,param);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  this_02 = (ArtificialPopulation *)operator_new(0x98);
  ArtificialPopulation::ArtificialPopulation(this_02,this_00);
  this_03 = (Population *)operator_new(0x60);
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"iaf_psc_alpha","");
  Population::Population(this_03,1,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  this_04 = (Population *)operator_new(0x60);
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"iaf_psc_alpha","");
  Population::Population(this_04,1,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  this_05 = (Population *)operator_new(0x60);
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"PassThrough","");
  Population::Population(this_05,1,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  pLVar3 = (LatencyEncodingSynapse_param *)operator_new(8);
  pLVar3->window_length_s = local_180;
  this_06 = (LatencyEncodingSynapse *)operator_new(0x68);
  LatencyEncodingSynapse::LatencyEncodingSynapse(this_06,this_01,this_03,pLVar3);
  pLVar4 = (LatencyDecodingSynapse_param *)operator_new(0x10);
  pLVar4->window_length_s = local_180;
  pLVar4->delay_s = 0.004;
  this_07 = (LatencyDecodingSynapse *)operator_new(0x68);
  LatencyDecodingSynapse::LatencyDecodingSynapse(this_07,this_03,(Population *)this_02,pLVar4);
  pLVar3 = (LatencyEncodingSynapse_param *)operator_new(8);
  pLVar3->window_length_s = local_180;
  this_08 = (LatencyEncodingSynapse *)operator_new(0x68);
  LatencyEncodingSynapse::LatencyEncodingSynapse(this_08,(Population *)this_02,this_04,pLVar3);
  pLVar4 = (LatencyDecodingSynapse_param *)operator_new(0x10);
  pLVar4->window_length_s = local_180;
  pLVar4->delay_s = 0.003;
  this_09 = (LatencyDecodingSynapse *)operator_new(0x68);
  LatencyDecodingSynapse::LatencyDecodingSynapse(this_09,this_04,this_05,pLVar4);
  param_00 = (Network_param *)operator_new(8);
  param_00->dt = local_168;
  Network::Network(&local_78,param_00);
  Network::add(&local_78,(Synapse *)this_06);
  Network::add(&local_78,(Synapse *)this_07);
  Network::add(&local_78,(Synapse *)this_08);
  Network::add(&local_78,(Synapse *)this_09);
  poVar5 = std::ostream::_M_insert<long>((long)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  poVar5 = std::ostream::_M_insert<long>((long)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  poVar5 = std::ostream::_M_insert<long>((long)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  poVar5 = std::ostream::_M_insert<long>((long)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  Network::run(&local_78,10.0);
  Network::~Network(&local_78);
  if (local_138 != local_128) {
    operator_delete(local_138,local_128[0] + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]) 
{
    srand(time(NULL));

    // Command line arguments
    double sine1 = 1;
    double sine2 = 0;
    double sine3 = 0;
    double sine4 = 0;
    double sine5 = 0;
    double sine6 = 0;
    double sine7 = 0;
    double window_length = 20;
    double dt = 0.0001;
    string filterType = "lowpass";
    if(argc == 11) {
        sine1 = atof(argv[1]);
        sine2 = atof(argv[2]);
        sine3 = atof(argv[3]);
        sine4 = atof(argv[4]);
        sine5 = atof(argv[5]);
        sine6 = atof(argv[6]);
        sine7 = atof(argv[7]);
        window_length = atof(argv[8]);
        dt = atof(argv[9]);
        filterType = argv[10];
    }
    // ----------------------

    Clock::getInstance()->setDt(dt);

    ANN* ann = new ANN();
    ann->setInputSize(1);
    ann->addLayer(1, filterType);

    // Populations
    SignalGenerator_param* paramp1 = new SignalGenerator_param();
    paramp1->f1 = sine1;
    paramp1->f2 = sine2;
    paramp1->f3 = sine3;
    paramp1->f4 = sine4;
    paramp1->f5 = sine5;
    paramp1->f6 = sine6;
    paramp1->f7 = sine7;
    paramp1->scale = 1/5.0;
    paramp1->offset = 0.5;
    Population* p1 = new Population(1, "SignalGenerator", paramp1);

    ArtificialPopulation* p2 = new ArtificialPopulation(ann);

    Population* p3 = new Population(1, "iaf_psc_alpha");
    Population* p4 = new Population(1, "iaf_psc_alpha");
    Population* p5 = new Population(1, "PassThrough");

    // Synapses
    LatencyEncodingSynapse_param* params1 = new LatencyEncodingSynapse_param();
    params1->window_length_s = window_length;
    LatencyEncodingSynapse* s1 = new LatencyEncodingSynapse(p1, p3, params1);

    LatencyDecodingSynapse_param* params2 = new LatencyDecodingSynapse_param();
    params2->window_length_s = window_length;
    params2->delay_s = 0.004;
    LatencyDecodingSynapse* s2 = new LatencyDecodingSynapse(p3, p2, params2);

    // Synapses
    LatencyEncodingSynapse_param* params3 = new LatencyEncodingSynapse_param();
    params3->window_length_s = window_length;
    LatencyEncodingSynapse* s3 = new LatencyEncodingSynapse(p2, p4, params3);

    LatencyDecodingSynapse_param* params4 = new LatencyDecodingSynapse_param();
    params4->window_length_s = window_length;
    params4->delay_s = 0.003;
    LatencyDecodingSynapse* s4 = new LatencyDecodingSynapse(p4, p5, params4);

    // Create the network
    Network_param* n_param = new Network_param();
    n_param->dt = dt;
    Network n = Network(n_param);

    // Add the synapse to the network
    n.add(s1);
    n.add(s2);
    n.add(s3);
    n.add(s4);

    cout << (long)s2 << endl;
    cout << (long)s4 << endl;
    cout << (long)p3 << endl;
    cout << (long)p4 << endl;

    // Run the network for 1 second
    n.run(10.0);
    
    return 0;
}